

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderPackingFunctionTests.cpp
# Opt level: O2

void __thiscall
vkt::shaderexecutor::UnpackUnorm2x16CaseInstance::~UnpackUnorm2x16CaseInstance
          (UnpackUnorm2x16CaseInstance *this)

{
  ShaderPackingFunctionTestInstance::~ShaderPackingFunctionTestInstance
            (&this->super_ShaderPackingFunctionTestInstance);
  operator_delete(this,0xa8);
  return;
}

Assistant:

UnpackUnorm2x16CaseInstance (Context& context, glu::ShaderType shaderType, const ShaderSpec& spec, const char* name)
		: ShaderPackingFunctionTestInstance (context, shaderType, spec, name)
	{
	}